

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O2

void __thiscall
fill<64U,_13U,_buffer_layout_bfs>::operator()
          (fill<64U,_13U,_buffer_layout_bfs> *this,array<Stream,_64UL> *streams,uchar **buffer,
          array<unsigned_long,_64UL> *buffer_count)

{
  uchar *puVar1;
  uchar **ppuVar2;
  int iVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  unsigned_long *puVar6;
  uchar **ppuVar7;
  long lVar8;
  size_t __n;
  size_t sVar9;
  unsigned_long *puVar10;
  fill<64U,_26U,_buffer_layout_bfs> local_64;
  fill<64U,_27U,_buffer_layout_bfs> local_63;
  fill<64U,_27U,_buffer_layout_bfs> local_62;
  fill<64U,_26U,_buffer_layout_bfs> local_61;
  uchar **local_60;
  array<Stream,_64UL> *local_58;
  unsigned_long *local_50;
  unsigned_long *local_48;
  uchar **local_40;
  uchar **local_38;
  
  puVar6 = buffer_count->_M_elems + 0x1a;
  local_48 = buffer_count->_M_elems + 0x1b;
  local_38 = buffer + 0x10bc;
  local_40 = buffer + 0x10c4;
  local_60 = buffer + 0xa6c;
  sVar9 = 0;
  lVar8 = 0;
  local_58 = streams;
  local_50 = puVar6;
  do {
    uVar4 = *puVar6;
    if (uVar4 == 0) {
      fill<64U,_26U,_buffer_layout_bfs>::operator()(&local_61,local_58,buffer,buffer_count);
      puVar6 = local_48;
      uVar4 = buffer_count->_M_elems[0x1a];
      if (uVar4 == 0) {
        uVar4 = *local_48;
        __n = -lVar8;
        lVar8 = -sVar9;
        break;
      }
    }
    puVar10 = local_48;
    uVar5 = *local_48;
    if (uVar5 == 0) {
      fill<64U,_27U,_buffer_layout_bfs>::operator()(&local_62,local_58,buffer,buffer_count);
      uVar4 = buffer_count->_M_elems[0x1a];
      uVar5 = buffer_count->_M_elems[0x1b];
      if (uVar5 == 0) {
        __n = -lVar8;
        lVar8 = -sVar9;
        puVar6 = local_50;
        goto LAB_0013ff87;
      }
    }
    ppuVar7 = local_38 + -uVar4 + 8;
    ppuVar2 = local_40 + -uVar5 + 8;
    iVar3 = cmp(buffer[-uVar4 + 0x10c4],buffer[-uVar5 + 0x10cc]);
    puVar6 = local_50;
    if (iVar3 < 1) {
      puVar10 = local_50;
      ppuVar2 = ppuVar7;
    }
    puVar1 = *ppuVar2;
    *puVar10 = *puVar10 - 1;
    buffer[sVar9 + 0xa6c] = puVar1;
    check_input(local_60,sVar9);
    lVar8 = lVar8 + -8;
    sVar9 = sVar9 + 1;
    if (sVar9 == 0x200) {
      buffer_count->_M_elems[0xd] = 0x200;
      return;
    }
  } while( true );
  do {
    if (uVar4 == 0) {
      fill<64U,_27U,_buffer_layout_bfs>::operator()(&local_63,local_58,buffer,buffer_count);
      uVar4 = buffer_count->_M_elems[0x1b];
      if (uVar4 == 0) goto LAB_0013fff5;
    }
    *(uchar **)((long)buffer + __n + 0x5360) = buffer[0x10cc - uVar4];
    uVar4 = uVar4 - 1;
    *puVar6 = uVar4;
    lVar8 = lVar8 + -1;
    __n = __n + 8;
  } while (__n != 0x1000);
  goto LAB_0013ffdc;
LAB_0013fff5:
  ppuVar7 = (uchar **)((long)buffer + (0x6360 - __n));
  sVar9 = -lVar8;
  memmove(buffer + lVar8 + 0xc6c,local_60,__n);
  buffer_count->_M_elems[0xd] = sVar9;
  goto LAB_0014002a;
  while( true ) {
    *(uchar **)((long)buffer + __n + 0x5360) = buffer[0x10c4 - uVar4];
    uVar4 = uVar4 - 1;
    *puVar6 = uVar4;
    lVar8 = lVar8 + -1;
    __n = __n + 8;
    if (__n == 0x1000) break;
LAB_0013ff87:
    if (uVar4 == 0) {
      fill<64U,_26U,_buffer_layout_bfs>::operator()(&local_64,local_58,buffer,buffer_count);
      uVar4 = buffer_count->_M_elems[0x1a];
      puVar6 = local_50;
      if (uVar4 == 0) goto LAB_0013fff5;
    }
  }
LAB_0013ffdc:
  buffer_count->_M_elems[0xd] = 0x200;
  sVar9 = 0x200;
  ppuVar7 = local_60;
LAB_0014002a:
  check_input(ppuVar7,sVar9);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}